

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TagSet::add(TagSet *this,Tag *tag)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  size_type sVar4;
  string lc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>
  local_78;
  
  local_98 = local_88;
  pcVar1 = (tag->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + (tag->m_name)._M_string_length);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_98,local_98 + local_90);
  _Var2._M_p = local_b8._M_dataplus._M_p;
  if (local_b8._M_string_length != 0) {
    sVar4 = 0;
    do {
      iVar3 = tolower((int)_Var2._M_p[sVar4]);
      _Var2._M_p[sVar4] = (char)iVar3;
      sVar4 = sVar4 + 1;
    } while (local_b8._M_string_length != sVar4);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Tag>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_78,&local_b8,tag);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::Tag>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::Tag>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::Tag>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::Tag>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::Tag>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::Tag>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::Tag>>>
              *)this,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.second.m_name._M_dataplus._M_p != &local_78.second.m_name.field_2) {
    operator_delete(local_78.second.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
    operator_delete(local_78.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  return;
}

Assistant:

void add( Tag const& tag ) {
            m_tags.insert( std::make_pair( toLower( tag.getName() ), tag ) );
        }